

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O0

ptr<resp_msg> __thiscall nuraft::raft_server::handle_log_sync_req(raft_server *this,req_msg *req)

{
  bool bVar1;
  log_val_type lVar2;
  int iVar3;
  char *pcVar4;
  element_type *peVar5;
  undefined4 extraout_var;
  size_type sVar6;
  element_type *peVar7;
  element_type *peVar8;
  element_type *peVar9;
  ulong uVar10;
  buffer *pbVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  req_msg *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  sockaddr *__addr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  long in_RSI;
  element_type *in_RDI;
  ptr<resp_msg> pVar13;
  ulong in_stack_000000a0;
  raft_server *in_stack_000000a8;
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
  *entries;
  ptr<resp_msg> *resp;
  unsigned_long *in_stack_fffffffffffffe68;
  int *in_stack_fffffffffffffe70;
  atomic<bool> *in_stack_fffffffffffffe78;
  log_entry *in_stack_fffffffffffffe80;
  unsigned_long *in_stack_fffffffffffffe88;
  string local_d8 [32];
  string local_b8 [40];
  string local_90 [32];
  string local_70 [48];
  undefined8 local_40;
  int32 local_38;
  undefined4 local_34;
  ulong local_30;
  undefined1 local_21;
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
  *local_20;
  req_msg *local_18;
  
  local_18 = in_RDX;
  local_20 = req_msg::log_entries(in_RDX);
  local_21 = 0;
  std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1e2b23);
  local_30 = srv_state::get_term((srv_state *)0x1e2b2b);
  local_34 = 0xb;
  pcVar4 = (char *)(in_RSI + 0x38);
  local_38 = msg_base::get_src(&local_18->super_msg_base);
  peVar5 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1e2b7d);
  iVar3 = (*peVar5->_vptr_log_store[2])();
  local_40 = CONCAT44(extraout_var,iVar3);
  cs_new<nuraft::resp_msg,unsigned_long,nuraft::msg_type,int&,int,unsigned_long>
            (in_stack_fffffffffffffe88,(msg_type *)in_stack_fffffffffffffe80,
             (int *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
  if (bVar1) {
    peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1e2bf4);
    iVar3 = (**(code **)(*(long *)peVar8 + 0x38))();
    if (4 < iVar3) {
      peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1e2c2d);
      sVar6 = std::
              vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
              ::size(local_20);
      std::
      vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
      ::operator[](local_20,0);
      peVar7 = std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1e2c62);
      lVar2 = log_entry::get_val_type(peVar7);
      bVar1 = std::atomic::operator_cast_to_bool(in_stack_fffffffffffffe78);
      pcVar4 = "false";
      if (bVar1) {
        pcVar4 = "true";
      }
      msg_if_given_abi_cxx11_
                ((char *)local_70,"entries size %d, type %d, catching_up %s\n",sVar6 & 0xffffffff,
                 (ulong)lVar2,pcVar4);
      pcVar4 = "handle_log_sync_req";
      (**(code **)(*(long *)peVar8 + 0x40))
                (peVar8,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                 ,"handle_log_sync_req",0x142,local_70);
      std::__cxx11::string::~string(local_70);
    }
  }
  sVar6 = std::
          vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
          ::size(local_20);
  if (sVar6 == 1) {
    std::
    vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
    ::operator[](local_20,0);
    peVar7 = std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1e2d84);
    lVar2 = log_entry::get_val_type(peVar7);
    if (lVar2 == log_pack) {
      bVar1 = std::atomic::operator_cast_to_bool(in_stack_fffffffffffffe78);
      if (bVar1) {
        peVar5 = std::
                 __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1e3007);
        uVar10 = req_msg::get_last_log_idx(local_18);
        std::
        vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
        ::operator[](local_20,0);
        std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1e3046);
        pbVar11 = log_entry::get_buf(in_stack_fffffffffffffe80);
        (*peVar5->_vptr_log_store[0xd])(peVar5,uVar10 + 1,pbVar11);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
        if (bVar1) {
          peVar8 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1e30a0);
          iVar3 = (**(code **)(*(long *)peVar8 + 0x38))();
          if (4 < iVar3) {
            peVar8 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1e30d3);
            peVar5 = std::
                     __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x1e30ec);
            iVar3 = (*peVar5->_vptr_log_store[2])();
            msg_if_given_abi_cxx11_
                      ((char *)local_d8,"last log %lu",CONCAT44(extraout_var_00,iVar3) + -1);
            pcVar4 = "handle_log_sync_req";
            (**(code **)(*(long *)peVar8 + 0x40))
                      (peVar8,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                       ,"handle_log_sync_req",0x152,local_d8);
            std::__cxx11::string::~string(local_d8);
          }
        }
        peVar5 = std::
                 __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1e3199);
        iVar3 = (*peVar5->_vptr_log_store[2])();
        std::__atomic_base<unsigned_long>::operator=
                  ((__atomic_base<unsigned_long> *)CONCAT44(extraout_var_01,iVar3),
                   (__int_type)in_stack_fffffffffffffe78);
        peVar5 = std::
                 __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1e31dc);
        (*peVar5->_vptr_log_store[2])();
        commit(in_stack_000000a8,in_stack_000000a0);
        peVar9 = std::
                 __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1e3213);
        peVar5 = std::
                 __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1e322b);
        iVar3 = (*peVar5->_vptr_log_store[2])();
        resp_msg::accept(peVar9,iVar3,__addr,(socklen_t *)pcVar4);
        _Var12._M_pi = extraout_RDX_05;
      }
      else {
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
        _Var12._M_pi = extraout_RDX_02;
        if (bVar1) {
          peVar8 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1e2f04);
          iVar3 = (**(code **)(*(long *)peVar8 + 0x38))();
          _Var12._M_pi = extraout_RDX_03;
          if (2 < iVar3) {
            peVar8 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1e2f37);
            peVar9 = std::
                     __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x1e2f49);
            uVar10 = resp_msg::get_next_idx(peVar9);
            msg_if_given_abi_cxx11_
                      ((char *)local_b8,
                       "This server is ready for cluster, ignore the request, my next log idx %lu",
                       uVar10);
            (**(code **)(*(long *)peVar8 + 0x40))
                      (peVar8,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                       ,"handle_log_sync_req",0x14d,local_b8);
            std::__cxx11::string::~string(local_b8);
            _Var12._M_pi = extraout_RDX_04;
          }
        }
      }
      goto LAB_001e3261;
    }
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
  _Var12._M_pi = extraout_RDX;
  if (bVar1) {
    peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1e2dd9);
    iVar3 = (**(code **)(*(long *)peVar8 + 0x38))();
    _Var12._M_pi = extraout_RDX_00;
    if (2 < iVar3) {
      peVar8 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1e2e0c);
      sVar6 = std::
              vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
              ::size(local_20);
      msg_if_given_abi_cxx11_
                ((char *)local_90,
                 "receive an invalid LogSyncRequest as the log entry value doesn\'t meet the requirements: entries size %zu"
                 ,sVar6);
      (**(code **)(*(long *)peVar8 + 0x40))
                (peVar8,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                 ,"handle_log_sync_req",0x147,local_90);
      std::__cxx11::string::~string(local_90);
      _Var12._M_pi = extraout_RDX_01;
    }
  }
LAB_001e3261:
  pVar13.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var12._M_pi;
  pVar13.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<resp_msg>)pVar13.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_log_sync_req(req_msg& req) {
    std::vector<ptr<log_entry>>& entries = req.log_entries();
    ptr<resp_msg> resp
        ( cs_new<resp_msg>
          ( state_->get_term(), msg_type::sync_log_response, id_,
            req.get_src(), log_store_->next_slot() ) );

    p_db("entries size %d, type %d, catching_up %s\n",
         (int)entries.size(), (int)entries[0]->get_val_type(),
         (catching_up_)?"true":"false");
    if ( entries.size() != 1 ||
         entries[0]->get_val_type() != log_val_type::log_pack ) {
        p_wn("receive an invalid LogSyncRequest as the log entry value "
             "doesn't meet the requirements: entries size %zu",
             entries.size() );
        return resp;
    }

    if (!catching_up_) {
        p_wn("This server is ready for cluster, ignore the request, "
             "my next log idx %" PRIu64 "", resp->get_next_idx());
        return resp;
    }

    log_store_->apply_pack(req.get_last_log_idx() + 1, entries[0]->get_buf());
    p_db("last log %" PRIu64, log_store_->next_slot() - 1);
    precommit_index_ = log_store_->next_slot() - 1;
    commit(log_store_->next_slot() - 1);
    resp->accept(log_store_->next_slot());
    return resp;
}